

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimSpecRecursively
          (Impl *this,int parent,int current,PrimSpec *parentPrimSpec,int level,
          PathIndexToSpecIndexMap *psmap,Layer *layer)

{
  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  *this_00;
  map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  *pmVar1;
  pointer pNVar2;
  long lVar3;
  pointer piVar4;
  Impl *pIVar5;
  bool bVar6;
  char cVar7;
  ostream *poVar8;
  size_type sVar9;
  value_type *pvVar10;
  long lVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  size_type sVar15;
  mapped_type *pmVar16;
  mapped_type *this_01;
  size_type sVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  value_type *pvVar21;
  mapped_type *this_02;
  int iVar22;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *this_03;
  bool bVar23;
  char *pcVar24;
  pointer piVar25;
  size_t i;
  ulong uVar26;
  int current_local;
  char local_d49;
  Impl *local_d48;
  int parent_local;
  PrimSpec *local_d38;
  map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  *local_d30;
  pointer local_d28;
  string variantName;
  string variantSetName;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks;
  string local_ca0;
  string prop_name;
  string local_c60 [344];
  PrimSpec variant;
  optional<tinyusdz::PrimSpec> primspec;
  
  current_local = current;
  parent_local = parent;
  if ((int)(this->_config).kMaxPrimNestLevel < level) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&primspec);
    poVar8 = ::std::operator<<((ostream *)&primspec,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,"[USDC]");
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xdd0);
    ::std::operator<<(poVar8," ");
    poVar8 = ::std::operator<<((ostream *)&primspec,"PrimSpec hierarchy is too deep.");
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&variant);
    ::std::__cxx11::string::_M_dispose();
LAB_001647b3:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&primspec);
    return false;
  }
  if ((current < 0) ||
     ((int)(((long)(this->_nodes).
                   super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_nodes).
                  super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x1f8) <= current)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&primspec);
    poVar8 = ::std::operator<<((ostream *)&primspec,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xdd9);
    ::std::operator<<(poVar8," ");
    ::std::__cxx11::to_string(&variantName,current_local);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variantSetName,"Invalid current node id: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variantName);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variantSetName,". Must be in range [0, ");
    std::__cxx11::to_string
              (&local_ca0,
               ((long)(this->_nodes).
                      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_nodes).
                     super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1f8);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop_name
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,
                     &local_ca0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&variant,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop_name
                     ,")");
    poVar8 = ::std::operator<<((ostream *)&primspec,(string *)&variant);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&variant);
    ::std::__cxx11::string::_M_dispose();
    goto LAB_001647b3;
  }
  primspec.has_value_ = false;
  bVar23 = false;
  local_d38 = parentPrimSpec;
  memset(&primspec.contained,0,0x568);
  iVar22 = (int)parentPrimSpec;
  this_00 = &this->_variantPrims;
  sVar9 = ::std::
          map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
          ::count(this_00,&parent_local);
  bVar6 = ReconstructPrimSpecNode
                    (this,parent_local,current_local,iVar22,sVar9 != 0,psmap,layer,&primspec);
  if (!bVar6) goto LAB_00165374;
  local_d48 = (Impl *)this_00;
  if (primspec.has_value_ == true) {
    pvVar10 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value(&primspec);
  }
  else {
    pvVar10 = (PrimSpec *)0x0;
  }
  iVar22 = current_local;
  pNVar2 = (this->_nodes).
           super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)current_local;
  uVar26 = 0;
  do {
    lVar3 = *(long *)&pNVar2[lVar11]._children.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pNVar2[iVar22]._children.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl + 8) - lVar3 >> 3) <= uVar26) {
      sVar12 = ::std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::count(&this->_variantPropChildren,&current_local);
      pIVar5 = local_d48;
      if (sVar12 == 0) goto LAB_00164d78;
      sVar9 = ::std::
              map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
              ::count((map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                       *)local_d48,&current_local);
      if (sVar9 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
        poVar8 = ::std::operator<<((ostream *)&variant,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe12);
        ::std::operator<<(poVar8," ");
        pcVar24 = "Internal error: variant attribute is not a child of VariantPrim.";
      }
      else if (local_d38 == (PrimSpec *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
        poVar8 = ::std::operator<<((ostream *)&variant,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe16);
        ::std::operator<<(poVar8," ");
        pcVar24 = "Internal error: parentPrimSpec should exist.";
      }
      else {
        pmVar13 = ::std::
                  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                  ::at((map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                        *)pIVar5,&current_local);
        bVar6 = is_variantElementName(&(pmVar13->_elementPath)._prim_part);
        if (bVar6) {
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::array(&toks);
          bVar6 = tokenize_variantElement(&(pmVar13->_elementPath)._prim_part,&toks);
          if (bVar6) {
            ::std::__cxx11::string::string((string *)&variantSetName,(string *)&toks);
            ::std::__cxx11::string::string((string *)&variantName,(string *)(toks._M_elems + 1));
            PrimSpec::PrimSpec(&variant);
            pmVar14 = ::std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(&this->_variantPropChildren,&current_local);
            piVar25 = (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            piVar4 = (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            local_d48 = this;
            goto LAB_00164928;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
          poVar8 = ::std::operator<<((ostream *)&variant,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe25);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)&variant,"Invalid variant element_name.");
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&prop_name);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::~array(&toks);
          break;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
        poVar8 = ::std::operator<<((ostream *)&variant,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe20);
        ::std::operator<<(poVar8," ");
        pcVar24 = "Corrupted Crate. VariantAttribute is not the child of VariantPrim.";
      }
      poVar8 = ::std::operator<<((ostream *)&variant,pcVar24);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::stringbuf::str();
      goto LAB_0016535a;
    }
    bVar6 = ReconstructPrimSpecRecursively
                      (this,current_local,*(int *)(lVar3 + uVar26 * 8),pvVar10,level + 1,psmap,layer
                      );
    uVar26 = uVar26 + 1;
  } while (bVar6);
  goto LAB_00165372;
LAB_00164928:
  if (piVar25 == piVar4) goto LAB_00164c19;
  sVar15 = ::std::
           map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
           ::count(&this->_variantProps,piVar25);
  if (sVar15 == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop_name);
    poVar8 = ::std::operator<<((ostream *)&prop_name,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe30);
    ::std::operator<<(poVar8," ");
    poVar8 = ::std::operator<<((ostream *)&prop_name,"Internal error: variant Property not found.");
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::stringbuf::str();
    this = local_d48;
    PushError(local_d48,(string *)&local_ca0);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop_name);
    goto LAB_00164d44;
  }
  pmVar16 = ::std::
            map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
            ::at(&this->_variantProps,piVar25);
  ::std::__cxx11::string::string((string *)&prop_name,(string *)&(pmVar16->first)._prop_part);
  this_01 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::operator[](&variant._props,&prop_name);
  Property::operator=(this_01,&pmVar16->second);
  ::std::__cxx11::string::_M_dispose();
  piVar25 = piVar25 + 1;
  goto LAB_00164928;
LAB_00164c19:
  pmVar19 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
            ::operator[](&local_d38->_variantSets,&variantSetName);
  if ((pmVar19->name)._M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)pmVar19);
  }
  pmVar20 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
            ::operator[](&pmVar19->variantSet,&variantName);
  PrimSpec::operator=(pmVar20,&variant);
  this = local_d48;
LAB_00164d44:
  PrimSpec::~PrimSpec(&variant);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  ::~array(&toks);
  if (piVar25 == piVar4) {
LAB_00164d78:
    local_d48 = this;
    sVar12 = ::std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::count(&this->_variantPrimChildren,&current_local);
    if (sVar12 == 0) {
LAB_00164fdd:
      pIVar5 = local_d48;
      if (parent_local == 0) {
        bVar23 = true;
        if (primspec.has_value_ == true) {
          pvVar10 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value(&primspec);
          pvVar21 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value(&primspec);
          this_02 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&layer->_prim_specs,&pvVar21->_name);
          PrimSpec::operator=(this_02,pvVar10);
        }
      }
      else {
        pmVar1 = &local_d48->_variantPrimSpecs;
        sVar17 = ::std::
                 map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                 ::count(pmVar1,&parent_local);
        if (sVar17 == 0) {
          bVar23 = true;
          if (local_d38 != (PrimSpec *)0x0 && primspec.has_value_ == true) {
            this_03 = &local_d38->_children;
            pvVar10 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value(&primspec);
            ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
            emplace_back<tinyusdz::PrimSpec>(this_03,pvVar10);
          }
        }
        else {
          if (primspec.has_value_ == false) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
            poVar8 = ::std::operator<<((ostream *)&variant,"[warn]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe7c);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)&variant,
                                       "parent is variantPrim, but current is not Prim.");
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::stringbuf::str();
            PushWarn(pIVar5,&prop_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
          }
          else {
            pmVar18 = ::std::
                      map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                      ::at(pmVar1,&parent_local);
            pvVar10 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value(&primspec);
            ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
            emplace_back<tinyusdz::PrimSpec>(&pmVar18->_children,pvVar10);
          }
          bVar23 = true;
        }
      }
      goto LAB_00165374;
    }
    if (primspec.has_value_ != false) {
      pmVar14 = ::std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::at(&this->_variantPrimChildren,&current_local);
      piVar25 = (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_d28 = (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      local_d30 = &local_d48->_variantPrimSpecs;
      do {
        pmVar1 = local_d30;
        if (piVar25 == local_d28) goto LAB_00164fdd;
        sVar17 = ::std::
                 map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                 ::count(local_d30,piVar25);
        if (sVar17 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
          poVar8 = ::std::operator<<((ostream *)&variant,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe52);
          ::std::operator<<(poVar8," ");
          pcVar24 = "Internal error: variant Prim children not found.";
          goto LAB_00165326;
        }
        pmVar18 = ::std::
                  map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                  ::at(pmVar1,piVar25);
        bVar6 = is_variantElementName(&pmVar18->_name);
        if (!bVar6) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
          poVar8 = ::std::operator<<((ostream *)&variant,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe5b);
          ::std::operator<<(poVar8," ");
          pcVar24 = "Corrupted Crate. Variant Prim has invalid element_name.";
          goto LAB_00165326;
        }
        ::std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
        ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                 *)&prop_name);
        cVar7 = tokenize_variantElement
                          (&pmVar18->_name,
                           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                            *)&prop_name);
        if ((bool)cVar7) {
          local_d49 = cVar7;
          ::std::__cxx11::string::string((string *)&variant,(string *)&prop_name);
          ::std::__cxx11::string::string((string *)toks._M_elems,local_c60);
          pvVar10 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::operator->(&primspec);
          pmVar19 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                    ::operator[](&pvVar10->_variantSets,(key_type *)&variant);
          if ((pmVar19->name)._M_string_length == 0) {
            ::std::__cxx11::string::_M_assign((string *)pmVar19);
          }
          pmVar20 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                    ::operator[](&pmVar19->variantSet,toks._M_elems);
          PrimMetas::operator=(&pmVar20->_metas,&pmVar18->_metas);
          pmVar20 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                    ::operator[](&pmVar19->variantSet,toks._M_elems);
          ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::operator=
                    (&pmVar20->_children,&pmVar18->_children);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          cVar7 = local_d49;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
          poVar8 = ::std::operator<<((ostream *)&variant,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe60);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)&variant,"Invalid variant element_name.");
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(local_d48,toks._M_elems);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
        }
        ::std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
        ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *)&prop_name);
        piVar25 = piVar25 + 1;
        bVar23 = false;
      } while (cVar7 != '\0');
      goto LAB_00165374;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
    poVar8 = ::std::operator<<((ostream *)&variant,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimSpecRecursively");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xe49);
    ::std::operator<<(poVar8," ");
    pcVar24 = "Internal error: must be Prim.";
LAB_00165326:
    poVar8 = ::std::operator<<((ostream *)&variant,pcVar24);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::stringbuf::str();
    this = local_d48;
LAB_0016535a:
    PushError(this,&prop_name);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
  }
LAB_00165372:
  bVar23 = false;
LAB_00165374:
  nonstd::optional_lite::optional<tinyusdz::PrimSpec>::~optional(&primspec);
  return bVar23;
}

Assistant:

bool USDCReader::Impl::ReconstructPrimSpecRecursively(
    int parent, int current, PrimSpec *parentPrimSpec, int level,
    const PathIndexToSpecIndexMap &psmap, Layer *layer) {
  if (level > int32_t(_config.kMaxPrimNestLevel)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "PrimSpec hierarchy is too deep.");
  }

  DCOUT("ReconstructPrimRecursively: parent = "
        << std::to_string(parent) << ", current = " << current
        << ", level = " << std::to_string(level));

  if ((current < 0) || (current >= int(_nodes.size()))) {
    PUSH_ERROR("Invalid current node id: " + std::to_string(current) +
               ". Must be in range [0, " + std::to_string(_nodes.size()) + ")");
    return false;
  }

  // TODO: Refactor

  // null : parent node is Property or other Spec type.
  // non-null : parent node is PrimSpec
  PrimSpec *currPrimSpecPtr = nullptr;
  nonstd::optional<PrimSpec> primspec;

  // Assume parent node is already processed.
  bool is_parent_variant = _variantPrims.count(parent);

  if (!ReconstructPrimSpecNode(parent, current, level, is_parent_variant, psmap,
                           layer, &primspec)) {
    return false;
  }

  if (primspec) {
    currPrimSpecPtr = &(primspec.value());
  }

  {
    const crate::CrateReader::Node &node = _nodes[size_t(current)];
    DCOUT("node.Children.size = " << node.GetChildren().size());
    for (size_t i = 0; i < node.GetChildren().size(); i++) {
      DCOUT("Reconstuct Prim children: " << i << " / "
                                         << node.GetChildren().size());
      if (!ReconstructPrimSpecRecursively(current, int(node.GetChildren()[i]),
                                      currPrimSpecPtr, level + 1, psmap, layer)) {
        return false;
      }
      DCOUT("DONE Reconstuct PrimSpec children: " << i << " / "
                                              << node.GetChildren().size());
    }
  }

  //
  // Reonstruct variant
  //
  DCOUT(fmt::format("parent {}, current {}", parent, current));

  DCOUT(fmt::format("  has variant properties {}, has variant children {}",
    _variantPropChildren.count(current),
    _variantPrimChildren.count(current)));

  if (_variantPropChildren.count(current)) {

    // - parentPrim
    //   - variantPrim(SpecTypeVariant) <- current
    //     - variant property(SpecTypeAttribute)

    //
    // `current` must be VariantPrim and `parentPrim` should exist
    //
    if (!_variantPrims.count(current)) {
      PUSH_ERROR_AND_RETURN("Internal error: variant attribute is not a child of VariantPrim.");
    }

    if (!parentPrimSpec) {
      PUSH_ERROR_AND_RETURN("Internal error: parentPrimSpec should exist.");
    }

    const Prim &variantPrim = _variantPrims.at(current);

    DCOUT("variant prim name: " << variantPrim.element_name());


    // element_name must be variant: "{variant=value}"
    if (!is_variantElementName(variantPrim.element_name())) {
      PUSH_ERROR_AND_RETURN("Corrupted Crate. VariantAttribute is not the child of VariantPrim.");
    }

    std::array<std::string, 2> toks;
    if (!tokenize_variantElement(variantPrim.element_name(), &toks)) {
      PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
    }

    std::string variantSetName = toks[0];
    std::string variantName = toks[1];

    PrimSpec variant;

    for (const auto &item : _variantPropChildren.at(current)) {
      // item should exist in _variantProps.
      if (!_variantProps.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Property not found.");
      }
      const std::pair<Path, Property> &pp = _variantProps.at(item);

      std::string prop_name = std::get<0>(pp).prop_part();
      DCOUT(fmt::format("  node_index = {}, prop name {}", item, prop_name));

      variant.props()[prop_name] = std::get<1>(pp);
    }

    VariantSetSpec &vs = parentPrimSpec->variantSets()[variantSetName];

    if (vs.name.empty()) {
      vs.name = variantSetName;
    }
    vs.variantSet[variantName] = variant;

  }

  if (_variantPrimChildren.count(current)) {

    // - currentPrim <- current
    //   - variant Prim children

    if (!primspec) {
      PUSH_ERROR_AND_RETURN("Internal error: must be Prim.");
    }

    DCOUT(fmt::format("{} has variant PrimSpec ", primspec->name()));


    for (const auto &item : _variantPrimChildren.at(current)) {

      if (!_variantPrimSpecs.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Prim children not found.");
      }

      const PrimSpec &vp = _variantPrimSpecs.at(item);

      DCOUT(fmt::format("  variantPrim name {}", vp.name()));

      // element_name must be variant: "{variant=value}"
      if (!is_variantElementName(vp.name())) {
        PUSH_ERROR_AND_RETURN("Corrupted Crate. Variant Prim has invalid element_name.");
      }

      std::array<std::string, 2> toks;
      if (!tokenize_variantElement(vp.name(), &toks)) {
        PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
      }

      std::string variantSetName = toks[0];
      std::string variantName = toks[1];

      VariantSetSpec &vs = primspec->variantSets()[variantSetName];

      if (vs.name.empty()) {
        vs.name = variantSetName;
      }
      vs.variantSet[variantName].metas() = vp.metas();
      DCOUT("# of primChildren = " << vp.children().size());
      vs.variantSet[variantName].children() = std::move(vp.children());

    }
  }

  if (parent == 0) {  // root prim
    if (primspec) {
      layer->primspecs()[primspec.value().name()] = std::move(primspec.value());
    }
  } else {
    if (_variantPrimSpecs.count(parent)) {
      // Add to variantPrim
      DCOUT("parent is variantPrim: " << parent);
      if (!primspec) {
        // FIXME: Validate current should be Prim.
        PUSH_WARN("parent is variantPrim, but current is not Prim.");
      } else {
        DCOUT("Adding prim to child...");
        PrimSpec &vps = _variantPrimSpecs.at(parent);
        vps.children().emplace_back(std::move(primspec.value()));
      }
    } else if (primspec && parentPrimSpec) {
      // Add to parent prim.
      parentPrimSpec->children().emplace_back(std::move(primspec.value()));
    }
  }

  return true;
}